

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.hpp
# Opt level: O2

Vartype cimod::ToCimodVartype(string *vartype_str)

{
  bool bVar1;
  Vartype VVar2;
  runtime_error *this;
  
  bVar1 = std::operator==(vartype_str,"SPIN");
  VVar2 = SPIN;
  if (!bVar1) {
    bVar1 = std::operator==(vartype_str,"BINARY");
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown vartype detected");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    VVar2 = BINARY;
  }
  return VVar2;
}

Assistant:

cimod::Vartype ToCimodVartype( const std::string &vartype_str ) {
    if ( vartype_str == "SPIN" ) {
      return Vartype::SPIN;
    } else if ( vartype_str == "BINARY" ) {
      return Vartype::BINARY;
    } else {
      throw std::runtime_error( "Unknown vartype detected" );
    }
  }